

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode create_conn_helper_init_proxy(connectdata *conn)

{
  Curl_easy *data;
  _Bool _Var1;
  CURLcode CVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *no_proxy;
  char cVar6;
  long lVar7;
  char *pcVar8;
  bool bVar9;
  char proxyuser [256];
  char local_238 [255];
  undefined1 local_139;
  char local_138 [255];
  undefined1 local_39;
  
  pcVar8 = local_238;
  data = conn->data;
  if ((conn->bits).proxy_user_passwd == true) {
    memset(local_238,0,0x100);
    memset(local_138,0,0x100);
    pcVar4 = (data->set).str[0x2c];
    if (pcVar4 != (char *)0x0) {
      strncpy(local_238,pcVar4,0x100);
      local_139 = 0;
    }
    pcVar4 = (data->set).str[0x2d];
    if (pcVar4 != (char *)0x0) {
      strncpy(local_138,pcVar4,0x100);
      local_39 = 0;
    }
    CVar2 = Curl_urldecode(data,local_238,0,&(conn->http_proxy).user,(size_t *)0x0,false);
    if (CVar2 == CURLE_OK) {
      CVar2 = Curl_urldecode(data,local_138,0,&(conn->http_proxy).passwd,(size_t *)0x0,false);
    }
    if (CVar2 == CURLE_OK) goto LAB_005707f4;
LAB_005707ec:
    pcVar5 = (char *)0x0;
  }
  else {
LAB_005707f4:
    pcVar4 = (data->set).str[0x15];
    if (pcVar4 == (char *)0x0) {
      pcVar4 = (char *)0x0;
LAB_00570832:
      pcVar5 = (data->set).str[0x16];
      if (pcVar5 == (char *)0x0) {
        pcVar5 = (char *)0x0;
      }
      else {
        pcVar5 = (*Curl_cstrdup)(pcVar5);
        if (pcVar5 == (char *)0x0) {
          pcVar5 = (char *)0x0;
          Curl_failf(data,"memory shortage");
          CVar2 = CURLE_OUT_OF_MEMORY;
          goto LAB_00570afd;
        }
      }
      no_proxy = curl_getenv("no_proxy");
      if (no_proxy == (char *)0x0) {
        no_proxy = curl_getenv("NO_PROXY");
      }
      _Var1 = check_noproxy((conn->host).name,(data->set).str[0x2e]);
      if ((_Var1) ||
         (((data->set).str[0x2e] == (char *)0x0 &&
          (_Var1 = check_noproxy((conn->host).name,no_proxy), _Var1)))) {
        (*Curl_cfree)(pcVar4);
        (*Curl_cfree)(pcVar5);
        pcVar5 = (char *)0x0;
        pcVar4 = (char *)0x0;
      }
      else if (pcVar4 == (char *)0x0 && pcVar5 == (char *)0x0) {
        pcVar4 = conn->handler->scheme;
        cVar6 = *pcVar4;
        while (cVar6 != '\0') {
          pcVar4 = pcVar4 + 1;
          iVar3 = tolower((int)cVar6);
          *pcVar8 = (char)iVar3;
          pcVar8 = (char *)((long)pcVar8 + 1);
          cVar6 = *pcVar4;
        }
        *(undefined4 *)((long)pcVar8 + 3) = 0x79786f;
        *(undefined4 *)pcVar8 = 0x6f72705f;
        pcVar4 = curl_getenv(local_238);
        if (pcVar4 == (char *)0x0) {
          iVar3 = Curl_strcasecompare("http_proxy",local_238);
          if (iVar3 == 0) {
            Curl_strntoupper(local_238,local_238,0x80);
            pcVar4 = curl_getenv(local_238);
          }
          else {
            pcVar4 = (char *)0x0;
          }
        }
        if ((pcVar4 == (char *)0x0) && (pcVar4 = curl_getenv("all_proxy"), pcVar4 == (char *)0x0)) {
          pcVar4 = curl_getenv("ALL_PROXY");
        }
        pcVar5 = (char *)0x0;
      }
      (*Curl_cfree)(no_proxy);
      if (pcVar4 == (char *)0x0) {
LAB_005709d7:
        pcVar4 = (char *)0x0;
      }
      else if ((*pcVar4 == '\0') || ((conn->handler->flags & 0x10) != 0)) {
        (*Curl_cfree)(pcVar4);
        goto LAB_005709d7;
      }
      if (pcVar5 == (char *)0x0) {
LAB_005709f9:
        pcVar5 = (char *)0x0;
      }
      else if ((*pcVar5 == '\0') || ((conn->handler->flags & 0x10) != 0)) {
        (*Curl_cfree)(pcVar5);
        goto LAB_005709f9;
      }
      if (pcVar4 == (char *)0x0 && pcVar5 == (char *)0x0) {
        (conn->bits).socksproxy = false;
        lVar7 = 0x3d6;
        bVar9 = false;
      }
      else {
        if (pcVar4 != (char *)0x0) {
          CVar2 = parse_proxy(data,conn,pcVar4,(conn->http_proxy).proxytype);
          (*Curl_cfree)(pcVar4);
          if (CVar2 != CURLE_OK) goto LAB_00570afa;
        }
        if (pcVar5 != (char *)0x0) {
          CVar2 = parse_proxy(data,conn,pcVar5,(conn->socks_proxy).proxytype);
          (*Curl_cfree)(pcVar5);
          if (CVar2 != CURLE_OK) goto LAB_005707ec;
        }
        pcVar8 = (conn->http_proxy).host.rawalloc;
        if (pcVar8 == (char *)0x0) {
          (conn->bits).httpproxy = false;
          lVar7 = 0x3e1;
          cVar6 = '\0';
        }
        else {
          cVar6 = '\x01';
          lVar7 = 0x3d6;
          if (((conn->handler->protocol & 3) == 0) && ((conn->bits).tunnel_proxy == false)) {
            conn->handler = &Curl_handler_http;
          }
        }
        (conn->chunk).hexbuffer[lVar7 + -0x20] = cVar6;
        bVar9 = (conn->socks_proxy).host.rawalloc != (char *)0x0;
        lVar7 = 0x3d7;
        if ((bVar9 && pcVar8 == (char *)0x0) &&
           (bVar9 = true, (conn->socks_proxy).user == (char *)0x0)) {
          pcVar8 = (conn->socks_proxy).passwd;
          (conn->socks_proxy).user = (conn->http_proxy).user;
          (conn->http_proxy).user = (char *)0x0;
          (*Curl_cfree)(pcVar8);
          (conn->socks_proxy).passwd = (conn->http_proxy).passwd;
          (conn->http_proxy).passwd = (char *)0x0;
        }
      }
      (conn->chunk).hexbuffer[lVar7 + -0x20] = bVar9;
      _Var1 = true;
      if ((conn->bits).httpproxy == false) {
        _Var1 = (conn->bits).socksproxy;
      }
      (conn->bits).proxy = _Var1;
      if (_Var1 == false) {
        (conn->bits).proxy = false;
        (conn->bits).httpproxy = false;
        (conn->bits).socksproxy = false;
        (conn->bits).proxy_user_passwd = false;
        (conn->bits).tunnel_proxy = false;
      }
      pcVar5 = (char *)0x0;
      CVar2 = CURLE_OK;
    }
    else {
      pcVar4 = (*Curl_cstrdup)(pcVar4);
      if (pcVar4 != (char *)0x0) goto LAB_00570832;
      pcVar5 = (char *)0x0;
      Curl_failf(data,"memory shortage");
      CVar2 = CURLE_OUT_OF_MEMORY;
    }
  }
LAB_00570afa:
  pcVar4 = (char *)0x0;
LAB_00570afd:
  (*Curl_cfree)(pcVar5);
  (*Curl_cfree)(pcVar4);
  return CVar2;
}

Assistant:

static CURLcode create_conn_helper_init_proxy(struct connectdata *conn)
{
  char *proxy = NULL;
  char *socksproxy = NULL;
  char *no_proxy = NULL;
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;

  /*************************************************************
   * Extract the user and password from the authentication string
   *************************************************************/
  if(conn->bits.proxy_user_passwd) {
    result = parse_proxy_auth(data, conn);
    if(result)
      goto out;
  }

  /*************************************************************
   * Detect what (if any) proxy to use
   *************************************************************/
  if(data->set.str[STRING_PROXY]) {
    proxy = strdup(data->set.str[STRING_PROXY]);
    /* if global proxy is set, this is it */
    if(NULL == proxy) {
      failf(data, "memory shortage");
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }
  }

  if(data->set.str[STRING_PRE_PROXY]) {
    socksproxy = strdup(data->set.str[STRING_PRE_PROXY]);
    /* if global socks proxy is set, this is it */
    if(NULL == socksproxy) {
      failf(data, "memory shortage");
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }
  }

  no_proxy = curl_getenv("no_proxy");
  if(!no_proxy)
    no_proxy = curl_getenv("NO_PROXY");

  if(check_noproxy(conn->host.name, data->set.str[STRING_NOPROXY]) ||
     (!data->set.str[STRING_NOPROXY] &&
      check_noproxy(conn->host.name, no_proxy))) {
    Curl_safefree(proxy);
    Curl_safefree(socksproxy);
  }
  else if(!proxy && !socksproxy)
#ifndef CURL_DISABLE_HTTP
    /* if the host is not in the noproxy list, detect proxy. */
    proxy = detect_proxy(conn);
#else  /* !CURL_DISABLE_HTTP */
    proxy = NULL;
#endif /* CURL_DISABLE_HTTP */

  Curl_safefree(no_proxy);

#ifdef USE_UNIX_SOCKETS
  /* For the time being do not mix proxy and unix domain sockets. See #1274 */
  if(proxy && conn->unix_domain_socket) {
    free(proxy);
    proxy = NULL;
  }
#endif

  if(proxy && (!*proxy || (conn->handler->flags & PROTOPT_NONETWORK))) {
    free(proxy);  /* Don't bother with an empty proxy string or if the
                     protocol doesn't work with network */
    proxy = NULL;
  }
  if(socksproxy && (!*socksproxy ||
                    (conn->handler->flags & PROTOPT_NONETWORK))) {
    free(socksproxy);  /* Don't bother with an empty socks proxy string or if
                          the protocol doesn't work with network */
    socksproxy = NULL;
  }

  /***********************************************************************
   * If this is supposed to use a proxy, we need to figure out the proxy host
   * name, proxy type and port number, so that we can re-use an existing
   * connection that may exist registered to the same proxy host.
   ***********************************************************************/
  if(proxy || socksproxy) {
    if(proxy) {
      result = parse_proxy(data, conn, proxy, conn->http_proxy.proxytype);
      Curl_safefree(proxy); /* parse_proxy copies the proxy string */
      if(result)
        goto out;
    }

    if(socksproxy) {
      result = parse_proxy(data, conn, socksproxy,
                           conn->socks_proxy.proxytype);
      /* parse_proxy copies the socks proxy string */
      Curl_safefree(socksproxy);
      if(result)
        goto out;
    }

    if(conn->http_proxy.host.rawalloc) {
#ifdef CURL_DISABLE_HTTP
      /* asking for a HTTP proxy is a bit funny when HTTP is disabled... */
      result = CURLE_UNSUPPORTED_PROTOCOL;
      goto out;
#else
      /* force this connection's protocol to become HTTP if not already
         compatible - if it isn't tunneling through */
      if(!(conn->handler->protocol & PROTO_FAMILY_HTTP) &&
         !conn->bits.tunnel_proxy)
        conn->handler = &Curl_handler_http;

      conn->bits.httpproxy = TRUE;
#endif
    }
    else {
      conn->bits.httpproxy = FALSE; /* not a HTTP proxy */
      conn->bits.tunnel_proxy = FALSE; /* no tunneling if not HTTP */
    }

    if(conn->socks_proxy.host.rawalloc) {
      if(!conn->http_proxy.host.rawalloc) {
        /* once a socks proxy */
        if(!conn->socks_proxy.user) {
          conn->socks_proxy.user = conn->http_proxy.user;
          conn->http_proxy.user = NULL;
          Curl_safefree(conn->socks_proxy.passwd);
          conn->socks_proxy.passwd = conn->http_proxy.passwd;
          conn->http_proxy.passwd = NULL;
        }
      }
      conn->bits.socksproxy = TRUE;
    }
    else
      conn->bits.socksproxy = FALSE; /* not a socks proxy */
  }
  else {
    conn->bits.socksproxy = FALSE;
    conn->bits.httpproxy = FALSE;
  }
  conn->bits.proxy = conn->bits.httpproxy || conn->bits.socksproxy;

  if(!conn->bits.proxy) {
    /* we aren't using the proxy after all... */
    conn->bits.proxy = FALSE;
    conn->bits.httpproxy = FALSE;
    conn->bits.socksproxy = FALSE;
    conn->bits.proxy_user_passwd = FALSE;
    conn->bits.tunnel_proxy = FALSE;
  }

out:

  free(socksproxy);
  free(proxy);
  return result;
}